

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

void __thiscall QPDFJob::CopyAttConfig::CopyAttConfig(CopyAttConfig *this,Config *c)

{
  this->config = c;
  CopyAttachmentFrom::CopyAttachmentFrom(&this->caf);
  return;
}

Assistant:

QPDFJob::CopyAttConfig::CopyAttConfig(Config* c) :
    config(c)
{
}